

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O3

bool bssl::ssl_public_key_verify
               (SSL *ssl,Span<const_unsigned_char> signature,uint16_t sigalg,EVP_PKEY *pkey,
               Span<const_unsigned_char> in)

{
  bool bVar1;
  int iVar2;
  EVP_MD_CTX local_50;
  
  EVP_MD_CTX_init((EVP_MD_CTX *)&local_50);
  bVar1 = setup_ctx(ssl,&local_50,pkey,sigalg,true);
  if (bVar1) {
    iVar2 = EVP_DigestVerify(&local_50,signature.data_,signature.size_,in.data_,in.size_);
    bVar1 = iVar2 != 0;
  }
  else {
    bVar1 = false;
  }
  EVP_MD_CTX_cleanup((EVP_MD_CTX *)&local_50);
  return bVar1;
}

Assistant:

bool ssl_public_key_verify(SSL *ssl, Span<const uint8_t> signature,
                           uint16_t sigalg, EVP_PKEY *pkey,
                           Span<const uint8_t> in) {
  ScopedEVP_MD_CTX ctx;
  if (!setup_ctx(ssl, ctx.get(), pkey, sigalg, true /* verify */)) {
    return false;
  }
  bool ok = EVP_DigestVerify(ctx.get(), signature.data(), signature.size(),
                             in.data(), in.size());
  if (CRYPTO_fuzzer_mode_enabled()) {
    ok = true;
    ERR_clear_error();
  }
  return ok;
}